

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::cpp_function<std::__cxx11::string,Person>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  function_record *rec;
  void *in_RDX;
  descr<14UL,_1UL> signature;
  char local_38 [16];
  type_info *local_28;
  undefined8 uStack_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  rec = make_function_record(this);
  rec->data[0] = (void *)f;
  rec->data[1] = in_RDX;
  rec->impl = initialize<pybind11::cpp_function::initialize<std::__cxx11::string,Person>(std::__cxx11::string(Person::*)()const)::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Person_const*)#1},std::__cxx11::string,Person_const*>(pybind11::cpp_function::initialize<std::__cxx11::string,Person>(std::__cxx11::string(Person::*)()const)::{lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}(Person_const*)#1}&&,std::__cxx11::string(*)(Person_const*))
              ::
              {lambda(pybind11::detail::function_record*,pybind11::handle,pybind11::handle,pybind11::handle)#1}
              ::handle_;
  local_28 = (type_info *)&Person::typeinfo;
  uStack_20 = 0;
  builtin_strncpy(local_38,"({%}) -> {str}",0xf);
  local_38[0xf] = '\0';
  initialize_generic(this,rec,local_38,&local_28,1);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) const PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](const Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*)(const Class *, Arg ...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }